

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlschemastypes(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  xmlNodePtr val;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  int nr;
  int nr_00;
  uint uVar22;
  undefined8 uVar23;
  int n_name;
  uint uVar24;
  uint uVar25;
  undefined4 uVar26;
  undefined8 uVar27;
  undefined4 uVar28;
  int test_ret;
  int iVar29;
  uint *puVar30;
  int test_ret_2;
  int iVar31;
  uint uVar32;
  undefined8 *puVar33;
  bool bVar34;
  int test_ret_12;
  int n_xws;
  int test_ret_1;
  int test_ret_6;
  int test_ret_7;
  int test_ret_5;
  int test_ret_9;
  int local_5c;
  undefined8 local_58;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  int local_3c;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing xmlschemastypes : 26 of 34 functions ...");
  }
  puVar33 = &DAT_00162d68;
  uVar24 = 0;
  iVar29 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar24 < 4) {
      uVar23 = *puVar33;
    }
    else {
      uVar23 = 0;
    }
    xmlSchemaCheckFacet(0,0,0,uVar23);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaCheckFacet",(ulong)(uint)(iVar3 - iVar2));
      iVar29 = iVar29 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar24 = uVar24 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  xmlSchemaCleanupTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar24 = 0;
  local_5c = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar24 < 4) {
      uVar23 = *puVar33;
    }
    else {
      uVar23 = 0;
    }
    lVar17 = xmlSchemaCollapseString(uVar23);
    if (lVar17 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaCollapseString",(ulong)(uint)(iVar3 - iVar2));
      local_5c = local_5c + 1;
      printf(" %d",(ulong)uVar24);
      putchar(10);
    }
    uVar24 = uVar24 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  iVar31 = 0;
  xmlSchemaCompareValues(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar4 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaCompareValues",(ulong)(uint)(iVar4 - iVar2));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar24 = 0;
  do {
    uVar25 = 0xffffffff;
    do {
      iVar4 = xmlMemBlocks();
      uVar20 = 0;
      uVar26 = 0;
      if (uVar24 - 1 < 3) {
        uVar26 = (&DAT_00152240)[uVar24 - 1];
      }
      if (uVar25 < 3) {
        uVar20 = (&DAT_00152240)[uVar25];
      }
      uVar25 = uVar25 + 1;
      xmlSchemaCompareValuesWhtsp(0,uVar26,0,uVar20);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaCompareValuesWhtsp",(ulong)(uint)(iVar5 - iVar4)
              );
        iVar31 = iVar31 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar24);
        printf(" %d",0);
        printf(" %d",(ulong)uVar25);
        putchar(10);
      }
    } while (uVar25 != 3);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 4);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlSchemaGetBuiltInListSimpleTypeItemType(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetBuiltInListSimpleTypeItemType",
           (ulong)(uint)(iVar6 - iVar4));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar24 = 0xffffffff;
  do {
    uVar26 = 0;
    if (uVar24 < 3) {
      uVar26 = (&DAT_00152234)[uVar24];
    }
    xmlSchemaGetBuiltInType(uVar26);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar24 = uVar24 + 1;
  } while (uVar24 != 3);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlSchemaGetCanonValue(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetCanonValue",(ulong)(uint)(iVar8 - iVar6));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar24 = 0xffffffff;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    uVar26 = 0;
    if (uVar24 < 3) {
      uVar26 = (&DAT_00152240)[uVar24];
    }
    uVar24 = uVar24 + 1;
    xmlSchemaGetCanonValueWhtsp(0,0,uVar26);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaGetCanonValueWhtsp",(ulong)(uint)(iVar10 - iVar9))
      ;
      iVar8 = iVar8 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
  } while (uVar24 != 3);
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlSchemaGetFacetValueAsULong(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar11 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetFacetValueAsULong",(ulong)(uint)(iVar11 - iVar9))
    ;
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar24 = 0;
  do {
    uVar25 = 0;
    puVar33 = &DAT_00162d68;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar24 < 4) {
        uVar23 = (&DAT_00162d68)[uVar24];
      }
      else {
        uVar23 = 0;
      }
      if (uVar25 < 4) {
        uVar27 = *puVar33;
      }
      else {
        uVar27 = 0;
      }
      xmlSchemaGetPredefinedType(uVar23,uVar27);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaGetPredefinedType",
               (ulong)(uint)(iVar13 - iVar12));
        iVar11 = iVar11 + 1;
        printf(" %d",(ulong)uVar24);
        printf(" %d");
        putchar(10);
      }
      uVar25 = uVar25 + 1;
      puVar33 = puVar33 + 1;
    } while (uVar25 != 5);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlSchemaGetValType(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    iVar14 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetValType",(ulong)(uint)(iVar14 - iVar12));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  xmlSchemaInitTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  puVar30 = &DAT_0015fd14;
  uVar24 = 0;
  local_4c = 0;
  do {
    iVar14 = xmlMemBlocks();
    val = (xmlNodePtr)(ulong)*puVar30;
    xmlSchemaIsBuiltInTypeFacet(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaIsBuiltInTypeFacet",(ulong)(uint)(iVar15 - iVar14)
            );
      local_4c = local_4c + 1;
      printf(" %d",0);
      val = (xmlNodePtr)(ulong)uVar24;
      printf(" %d");
      putchar(10);
    }
    uVar24 = uVar24 + 1;
    puVar30 = puVar30 + 1;
  } while (uVar24 != 4);
  function_tests = function_tests + 1;
  local_48 = &DAT_00162d68;
  iVar14 = 0;
  uVar24 = 0;
  do {
    uVar25 = 0;
    do {
      iVar16 = (int)val;
      iVar15 = xmlMemBlocks();
      if (uVar24 < 4) {
        uVar23 = (&DAT_00162d68)[uVar24];
      }
      else {
        uVar23 = 0;
      }
      val = gen_xmlNodePtr(uVar25,iVar16);
      xmlSchemaValPredefTypeNode(0,uVar23,0,val);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,val,nr);
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValPredefTypeNode",
               (ulong)(uint)(iVar16 - iVar15));
        iVar14 = iVar14 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar24);
        printf(" %d",0);
        val = (xmlNodePtr)(ulong)uVar25;
        printf(" %d");
        putchar(10);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != 3);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar24 = 0;
  do {
    uVar25 = 0;
    do {
      iVar16 = (int)val;
      iVar15 = xmlMemBlocks();
      if (uVar24 < 4) {
        uVar23 = (&DAT_00162d68)[uVar24];
      }
      else {
        uVar23 = 0;
      }
      val = gen_xmlNodePtr(uVar25,iVar16);
      xmlSchemaValPredefTypeNodeNoNorm(0,uVar23,0,val);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar25,val,nr_00);
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValPredefTypeNodeNoNorm",
               (ulong)(uint)(iVar16 - iVar15));
        local_50 = local_50 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar24);
        printf(" %d",0);
        val = (xmlNodePtr)(ulong)uVar25;
        printf(" %d");
        putchar(10);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != 3);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  iVar29 = local_5c + iVar29 + (uint)(iVar2 != iVar3) + iVar31 + (uint)(iVar4 != iVar5) +
           (uint)(iVar6 != iVar7) + iVar8 + (uint)(iVar9 != iVar10) + iVar11 +
           (uint)(iVar12 != iVar13) + local_4c;
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar24 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar24 < 4) {
      uVar23 = *local_48;
    }
    else {
      uVar23 = 0;
    }
    xmlSchemaValidateFacet(0,0,uVar23,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar31 = xmlMemBlocks();
    if (iVar3 != iVar31) {
      iVar31 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaValidateFacet",(ulong)(uint)(iVar31 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar24 = uVar24 + 1;
    local_48 = local_48 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  local_38 = &DAT_00162d68;
  local_4c = 0;
  uVar18 = 0;
  do {
    uVar24 = (int)uVar18 - 1;
    uVar19 = 0;
    do {
      uVar32 = (int)uVar19 - 1;
      uVar25 = 0;
      do {
        uVar22 = 0xffffffff;
        do {
          iVar3 = xmlMemBlocks();
          uVar20 = 0;
          uVar26 = 0;
          if (uVar24 < 3) {
            uVar26 = (&DAT_00152240)[uVar24];
          }
          if (uVar32 < 3) {
            uVar20 = (&DAT_00152234)[uVar32];
          }
          if (uVar25 < 4) {
            uVar23 = (&DAT_00162d68)[uVar25];
          }
          else {
            uVar23 = 0;
          }
          uVar28 = 0;
          if (uVar22 < 3) {
            uVar28 = (&DAT_00152240)[uVar22];
          }
          uVar22 = uVar22 + 1;
          xmlSchemaValidateFacetWhtsp(0,uVar26,uVar20,uVar23,0,uVar28);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          if (iVar3 != iVar31) {
            iVar31 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateFacetWhtsp",
                   (ulong)(uint)(iVar31 - iVar3));
            local_4c = local_4c + 1;
            printf(" %d",0);
            printf(" %d",uVar18);
            printf(" %d",uVar19);
            printf(" %d",(ulong)uVar25);
            printf(" %d",0);
            printf(" %d",(ulong)uVar22);
            putchar(10);
          }
        } while (uVar22 != 3);
        uVar25 = uVar25 + 1;
      } while (uVar25 != 5);
      uVar25 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar25;
    } while (uVar25 != 4);
    uVar24 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar24;
  } while (uVar24 != 4);
  iVar29 = iVar29 + iVar14 + local_50;
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar24 = 0;
  do {
    bVar1 = true;
    do {
      bVar34 = bVar1;
      iVar3 = xmlMemBlocks();
      if (uVar24 < 4) {
        uVar23 = (&DAT_00162d68)[uVar24];
      }
      else {
        uVar23 = 0;
      }
      uVar27 = 0;
      if (bVar34) {
        uVar27 = 0x1668f0;
      }
      xmlSchemaValidateLengthFacet(0,0,uVar23,0,uVar27);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar31 = xmlMemBlocks();
      if (iVar3 != iVar31) {
        iVar31 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidateLengthFacet",
               (ulong)(uint)(iVar31 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar24);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      bVar1 = false;
    } while (bVar34);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar24 = 0;
  do {
    uVar25 = 0;
    do {
      local_58 = 0;
      bVar1 = true;
      do {
        bVar34 = bVar1;
        uVar23 = 0;
        if (bVar34) {
          uVar23 = 0x1668f0;
        }
        uVar32 = 0xffffffff;
        do {
          iVar3 = xmlMemBlocks();
          uVar26 = 0;
          if (uVar24 - 1 < 3) {
            uVar26 = (&DAT_00152234)[uVar24 - 1];
          }
          if (uVar25 < 4) {
            uVar27 = (&DAT_00162d68)[uVar25];
          }
          else {
            uVar27 = 0;
          }
          uVar20 = 0;
          if (uVar32 < 3) {
            uVar20 = (&DAT_00152240)[uVar32];
          }
          uVar32 = uVar32 + 1;
          xmlSchemaValidateLengthFacetWhtsp(0,uVar26,uVar27,0,uVar23,uVar20);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          if (iVar3 != iVar31) {
            iVar31 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateLengthFacetWhtsp",
                   (ulong)(uint)(iVar31 - iVar3));
            local_50 = local_50 + 1;
            printf(" %d",0);
            printf(" %d",(ulong)uVar24);
            printf(" %d",(ulong)uVar25);
            printf(" %d",0);
            printf(" %d",local_58);
            printf(" %d");
            putchar(10);
          }
        } while (uVar32 != 3);
        local_58 = 1;
        bVar1 = false;
      } while (bVar34);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 4);
  function_tests = function_tests + 1;
  local_58._0_4_ = 0;
  uVar24 = 0;
  do {
    uVar18 = 0;
    do {
      bVar1 = true;
      do {
        bVar34 = bVar1;
        iVar3 = xmlMemBlocks();
        if (uVar24 < 4) {
          uVar23 = (&DAT_00162d68)[uVar24];
        }
        else {
          uVar23 = 0;
        }
        uVar27 = 0xffffffffffffffff;
        if ((uint)uVar18 < 3) {
          uVar27 = (&DAT_00152250)[uVar18];
        }
        uVar21 = 0;
        if (bVar34) {
          uVar21 = 0x1668e8;
        }
        xmlSchemaValidateListSimpleTypeFacet(0,uVar23,uVar27,uVar21);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar3 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateListSimpleTypeFacet",
                 (ulong)(uint)(iVar31 - iVar3));
          local_58._0_4_ = (int)local_58 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar24);
          printf(" %d",uVar18);
          printf(" %d");
          putchar(10);
        }
        bVar1 = false;
      } while (bVar34);
      uVar25 = (uint)uVar18 + 1;
      uVar18 = (ulong)uVar25;
    } while (uVar25 != 4);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar24 = 0;
  do {
    iVar31 = xmlMemBlocks();
    if (uVar24 < 4) {
      uVar23 = *local_38;
    }
    else {
      uVar23 = 0;
    }
    xmlSchemaValidatePredefinedType(0,uVar23,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar31 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaValidatePredefinedType",
             (ulong)(uint)(iVar4 - iVar31));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar24 = uVar24 + 1;
    local_38 = local_38 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  iVar31 = xmlMemBlocks();
  xmlSchemaValueAppend(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar31 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaValueAppend",(ulong)(uint)(iVar5 - iVar31));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlSchemaValueGetAsBoolean(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaValueGetAsBoolean",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlSchemaValueGetAsString(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaValueGetAsString",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar33 = &DAT_00162d68;
  uVar24 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (uVar24 < 4) {
      uVar23 = *puVar33;
    }
    else {
      uVar23 = 0;
    }
    lVar17 = xmlSchemaWhiteSpaceReplace(uVar23);
    if (lVar17 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaWhiteSpaceReplace",(ulong)(uint)(iVar11 - iVar10))
      ;
      iVar9 = iVar9 + 1;
      printf(" %d",(ulong)uVar24);
      putchar(10);
    }
    uVar24 = uVar24 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar24 != 5);
  function_tests = function_tests + 1;
  uVar24 = iVar29 + iVar2 + local_4c + local_3c + local_50 + (int)local_58 + iVar3 +
           (uint)(iVar31 != iVar4) + (uint)(iVar5 != iVar6) + (uint)(iVar7 != iVar8) + iVar9;
  if (uVar24 != 0) {
    printf("Module xmlschemastypes: %d errors\n",(ulong)uVar24);
  }
  return uVar24;
}

Assistant:

static int
test_xmlschemastypes(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemastypes : 26 of 34 functions ...\n");
    test_ret += test_xmlSchemaCheckFacet();
    test_ret += test_xmlSchemaCleanupTypes();
    test_ret += test_xmlSchemaCollapseString();
    test_ret += test_xmlSchemaCompareValues();
    test_ret += test_xmlSchemaCompareValuesWhtsp();
    test_ret += test_xmlSchemaCopyValue();
    test_ret += test_xmlSchemaGetBuiltInListSimpleTypeItemType();
    test_ret += test_xmlSchemaGetBuiltInType();
    test_ret += test_xmlSchemaGetCanonValue();
    test_ret += test_xmlSchemaGetCanonValueWhtsp();
    test_ret += test_xmlSchemaGetFacetValueAsULong();
    test_ret += test_xmlSchemaGetPredefinedType();
    test_ret += test_xmlSchemaGetValType();
    test_ret += test_xmlSchemaInitTypes();
    test_ret += test_xmlSchemaIsBuiltInTypeFacet();
    test_ret += test_xmlSchemaNewFacet();
    test_ret += test_xmlSchemaNewNOTATIONValue();
    test_ret += test_xmlSchemaNewQNameValue();
    test_ret += test_xmlSchemaNewStringValue();
    test_ret += test_xmlSchemaValPredefTypeNode();
    test_ret += test_xmlSchemaValPredefTypeNodeNoNorm();
    test_ret += test_xmlSchemaValidateFacet();
    test_ret += test_xmlSchemaValidateFacetWhtsp();
    test_ret += test_xmlSchemaValidateLengthFacet();
    test_ret += test_xmlSchemaValidateLengthFacetWhtsp();
    test_ret += test_xmlSchemaValidateListSimpleTypeFacet();
    test_ret += test_xmlSchemaValidatePredefinedType();
    test_ret += test_xmlSchemaValueAppend();
    test_ret += test_xmlSchemaValueGetAsBoolean();
    test_ret += test_xmlSchemaValueGetAsString();
    test_ret += test_xmlSchemaValueGetNext();
    test_ret += test_xmlSchemaWhiteSpaceReplace();

    if (test_ret != 0)
	printf("Module xmlschemastypes: %d errors\n", test_ret);
    return(test_ret);
}